

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# custom_settings.cpp
# Opt level: O2

void duckdb::AllowedDirectoriesSetting::SetGlobal
               (DatabaseInstance *db,DBConfig *config,Value *input)

{
  pointer pVVar1;
  vector<duckdb::Value,_true> *pvVar2;
  InvalidInputException *this;
  pointer this_00;
  allocator local_49;
  string local_48;
  
  if ((config->options).enable_external_access != false) {
    ::std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::clear(&(config->options).allowed_directories._M_t);
    pvVar2 = ListValue::GetChildren(input);
    pVVar1 = (pvVar2->super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>).
             super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.
             super__Vector_impl_data._M_finish;
    for (this_00 = (pvVar2->super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>).
                   super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.
                   super__Vector_impl_data._M_start; this_00 != pVVar1; this_00 = this_00 + 1) {
      Value::GetValue<std::__cxx11::string>(&local_48,this_00);
      DBConfig::AddAllowedDirectory(config,&local_48);
      ::std::__cxx11::string::~string((string *)&local_48);
    }
    return;
  }
  this = (InvalidInputException *)__cxa_allocate_exception(0x10);
  ::std::__cxx11::string::string
            ((string *)&local_48,
             "Cannot change allowed_directories when enable_external_access is disabled",&local_49);
  InvalidInputException::InvalidInputException(this,&local_48);
  __cxa_throw(this,&InvalidInputException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

void AllowedDirectoriesSetting::SetGlobal(DatabaseInstance *db, DBConfig &config, const Value &input) {
	if (!config.options.enable_external_access) {
		throw InvalidInputException("Cannot change allowed_directories when enable_external_access is disabled");
	}
	config.options.allowed_directories.clear();
	auto &list = ListValue::GetChildren(input);
	for (auto &val : list) {
		config.AddAllowedDirectory(val.GetValue<string>());
	}
}